

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFighting.cpp
# Opt level: O0

void __thiscall ProblemFireFighting::FillRewardModel(ProblemFireFighting *this)

{
  ulong uVar1;
  long *in_RDI;
  double dVar2;
  Index in_stack_0000000c;
  ProblemFireFighting *in_stack_00000010;
  double r;
  Index s2;
  Index ja;
  Index s1;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 0;
  while( true ) {
    uVar1 = (**(code **)(*in_RDI + 0x30))();
    if (uVar1 <= local_c) break;
    local_10 = 0;
    while( true ) {
      uVar1 = (**(code **)(*in_RDI + 0x70))();
      if (uVar1 <= local_10) break;
      local_14 = 0;
      while( true ) {
        uVar1 = (**(code **)(*in_RDI + 0x30))();
        if (uVar1 <= local_14) break;
        dVar2 = ComputeReward(in_stack_00000010,in_stack_0000000c);
        (**(code **)(*in_RDI + 0x188))(dVar2,in_RDI,local_c,local_10,local_14);
        local_14 = local_14 + 1;
      }
      local_10 = local_10 + 1;
    }
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void ProblemFireFighting::FillRewardModel()
{    

    for(Index s1=0; s1<GetNrStates();s1++) 
        for(Index ja=0; ja<GetNrJointActions(); ja++)
            for(Index s2=0; s2<GetNrStates();s2++) 
            {
                double r = ComputeReward(s2);
                SetReward(s1, ja, s2, r);
            }
}